

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O1

void __thiscall
Refal2::CQualifierParser::CQualifierParser(CQualifierParser *this,IErrorHandler *errorHandler)

{
  CModuleBuilder::CModuleBuilder(&this->super_CModuleBuilder,errorHandler);
  (this->super_CParsingElementState).state = PES_NotFinished;
  (this->token).type = TT_None;
  (this->token).word._M_dataplus._M_p = (pointer)&(this->token).word.field_2;
  (this->token).word._M_string_length = 0;
  (this->token).word.field_2._M_local_buf[0] = '\0';
  CQualifierBuilder::CQualifierBuilder(&this->builder);
  (this->namedQualifier).type = TT_None;
  (this->namedQualifier).word._M_dataplus._M_p = (pointer)&(this->namedQualifier).word.field_2;
  (this->namedQualifier).word._M_string_length = 0;
  (this->namedQualifier).word.field_2._M_local_buf[0] = '\0';
  CModuleBuilder::Reset(&this->super_CModuleBuilder);
  resetParser(this);
  return;
}

Assistant:

CQualifierParser::CQualifierParser( IErrorHandler* errorHandler ):
	CModuleBuilder( errorHandler )
{
	Reset();
}